

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O3

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  float fVar1;
  TestPrimitive TVar2;
  VkImageSubresourceRange subresourceRange;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  VkDevice pVVar6;
  VkCommandPool VVar7;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Context *pCVar13;
  Handle<(vk::HandleType)17> HVar14;
  Handle<(vk::HandleType)17> HVar15;
  TestStatus *pTVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  DeviceInterface *pDVar20;
  VkDevice pVVar21;
  Allocator *pAVar22;
  TextureFormat TVar23;
  const_iterator cVar24;
  DeviceInterface *pDVar25;
  int y;
  VkDeviceSize VVar26;
  int iVar27;
  int iVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  Random rng;
  VertexData data;
  ConstPixelBufferAccess resultImage;
  VkAttachmentReference colorAttachmentRef;
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined8 uStack_440;
  deUint32 local_438;
  VkSubpassDescription *local_430;
  deUint32 local_428;
  VkSubpassDependency *local_420;
  undefined1 local_418 [8];
  DeviceInterface *pDStack_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 uStack_3f8;
  deUint32 dStack_3f0;
  deUint32 dStack_3ec;
  VkSampleCountFlagBits VStack_3e8;
  VkImageTiling local_3e4;
  VkImageUsageFlags VStack_3e0;
  VkSharingMode VStack_3dc;
  deUint32 dStack_3d8;
  undefined4 uStack_3d4;
  deUint32 *local_3d0;
  VkImageLayout local_3c8;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined4 local_398;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  TextureFormat local_368;
  TextureFormat local_360;
  Context *local_358;
  TestPrimitive local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  CaseDef *local_330;
  ulong local_328;
  VkDeviceSize local_320;
  DeviceInterface *local_318;
  VkDevice local_310;
  float local_308;
  undefined1 local_2f8 [40];
  float afStack_2d0 [2];
  deUint32 *local_2c8;
  float afStack_2c0 [2];
  vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  local_2b8;
  VkDeviceSize local_2a0;
  TestPrimitive local_298;
  TextureFormat local_290;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_288;
  TextureFormat local_270;
  TextureFormat local_260;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_258;
  TextureFormat local_240;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_238;
  TextureFormat local_220;
  TextureFormat local_210;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_208;
  TextureFormat local_1f0;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1e8;
  TextureFormat local_1d0;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_1c8;
  TextureFormat local_1b0;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_1a8;
  TextureFormat local_190;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_188;
  TextureFormat local_170;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_168;
  TextureFormat local_150;
  DeviceInterface *pDStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  Move<vk::Handle<(vk::HandleType)17>_> local_108;
  TestStatus *local_e8;
  undefined1 local_e0 [12];
  int iStack_d4;
  float local_d0;
  int local_cc [2];
  float local_c4;
  undefined8 *local_c0;
  TextureFormat local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  TextureFormat local_98;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_90;
  undefined8 local_78;
  undefined8 uStack_70;
  deUint32 local_68;
  deUint32 *local_58;
  float afStack_50 [2];
  Vec4 local_48;
  undefined8 local_38;
  
  local_330 = caseDef;
  local_e8 = __return_storage_ptr__;
  pDVar20 = Context::getDeviceInterface(context);
  pVVar21 = Context::getDevice(context);
  local_358 = context;
  pAVar22 = Context::getDefaultAllocator(context);
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 1.0;
  local_48.m_data[3] = 1.0;
  local_58 = (deUint32 *)0x3f0000003f000000;
  afStack_50[0] = 1.0;
  afStack_50[1] = 1.0;
  TVar23 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar18 = tcu::getPixelSize(TVar23);
  VVar26 = (VkDeviceSize)(iVar18 << 0xe);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2f8,VVar26,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_418,pDVar20,pVVar21,
                     (VkBufferCreateInfo *)local_2f8,(VkAllocationCallbacks *)0x0);
  local_98.order = local_418._0_4_;
  local_98.type = local_418._4_4_;
  DStack_90.m_deviceIface = pDStack_410;
  local_318 = pDVar20;
  local_310 = pVVar21;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2f8,pDVar20,
             pVVar21,pAVar22,(VkBuffer)local_418,(MemoryRequirement)0x1);
  local_360.order = local_2f8._0_4_;
  local_360.type = local_2f8._4_4_;
  local_320 = VVar26;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2f8,VVar26,2);
  pVVar21 = local_310;
  pDVar20 = local_318;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_418,local_318,local_310,
                     (VkBufferCreateInfo *)local_2f8,(VkAllocationCallbacks *)0x0);
  local_b8.order = local_418._0_4_;
  local_b8.type = local_418._4_4_;
  DStack_b0.m_deviceIface = pDStack_410;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2f8,pDVar20,
             pVVar21,pAVar22,(VkBuffer)local_418,(MemoryRequirement)0x1);
  VVar26 = local_320;
  TVar23 = local_360;
  local_368.order = local_2f8._0_4_;
  local_368.type = local_2f8._4_4_;
  memset(*(void **)((long)local_360 + 0x18),0,local_320);
  ::vk::flushMappedMemoryRange
            (pDVar20,pVVar21,(VkDeviceMemory)((VkDeviceMemory *)((long)TVar23 + 8))->m_internal,
             *(VkDeviceSize *)((long)TVar23 + 0x10),VVar26);
  TVar23 = local_368;
  memset(*(void **)((long)local_368 + 0x18),0,VVar26);
  ::vk::flushMappedMemoryRange
            (pDVar20,pVVar21,(VkDeviceMemory)((VkDeviceMemory *)((long)TVar23 + 8))->m_internal,
             *(VkDeviceSize *)((long)TVar23 + 0x10),VVar26);
  local_348 = *(undefined8 *)(local_330->renderArea).m_data;
  uStack_340 = 0;
  local_388 = *(undefined8 *)((local_330->renderArea).m_data + 2);
  uStack_380 = 0;
  TVar2 = local_330->primitive;
  local_2f8._0_4_ = 0x80;
  local_2f8._4_4_ = 0x80;
  local_2f8._8_4_ = 5.1848e-44;
  local_2f8._12_4_ = 1;
  local_2f8._16_4_ = 0;
  local_2f8._20_4_ = 1;
  local_2f8._24_4_ = 0;
  local_2f8._28_4_ = 1;
  local_2f8._32_8_ = (void *)0x3f8000003f800000;
  afStack_2d0[0] = 1.0;
  afStack_2d0[1] = 1.0;
  local_2c8 = local_58;
  afStack_2c0[0] = afStack_50[0];
  afStack_2c0[1] = afStack_50[1];
  local_2b8.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init((deRandom *)local_458,0x4d2);
  fVar10 = fStack_3fc;
  fVar32 = fStack_400;
  fVar1 = fStack_404;
  fVar29 = local_408;
  local_328 = (ulong)TVar2;
  local_34c = TVar2;
  if (TEST_PRIMITIVE_BIG_TRIANGLE < TVar2) goto LAB_007f6224;
  fVar33 = (float)local_348 + (float)local_348 + -1.0;
  fVar34 = local_348._4_4_ + local_348._4_4_ + -1.0;
  local_388._0_4_ = (float)local_388 + (float)local_388;
  local_388._4_4_ = local_388._4_4_ + local_388._4_4_;
  fVar30 = (float)uStack_380 + (float)uStack_380;
  fVar31 = uStack_380._4_4_ + uStack_380._4_4_;
  local_348 = CONCAT44(fVar34,fVar33);
  uStack_340 = CONCAT44(uStack_340._4_4_ + uStack_340._4_4_ + 0.0,
                        (float)uStack_340 + (float)uStack_340 + 0.0);
  local_408 = (float)local_2f8._32_8_;
  fStack_404 = SUB84(local_2f8._32_8_,4);
  fStack_400 = afStack_2d0[0];
  fStack_3fc = afStack_2d0[1];
  switch(local_328) {
  case 0:
    uStack_380 = CONCAT44(fVar31,fVar30);
    iVar18 = 0x32;
    local_408 = fVar29;
    fStack_404 = fVar1;
    fStack_400 = fVar32;
    fStack_3fc = fVar10;
    do {
      local_378 = deRandom_getFloat((deRandom *)local_458);
      fVar29 = deRandom_getFloat((deRandom *)local_458);
      local_418._4_4_ = fVar29 * local_388._4_4_ + 0.0 + local_348._4_4_;
      local_418._0_4_ = local_378 * (float)local_388 + 0.0 + (float)local_348;
      pDStack_410 = (DeviceInterface *)0x3f80000000000000;
      local_408 = (float)local_2f8._32_8_;
      fStack_404 = SUB84(local_2f8._32_8_,4);
      fStack_400 = afStack_2d0[0];
      fStack_3fc = afStack_2d0[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_2b8,(value_type *)local_418);
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
    break;
  case 1:
    local_118 = (float)local_388 + -0.2;
    local_388 = CONCAT44(local_388._4_4_,local_388._4_4_ + -0.2);
    uStack_380 = CONCAT44(local_388._4_4_,local_388._4_4_);
    iVar18 = 0x1e;
    local_408 = fVar29;
    fStack_404 = fVar1;
    fStack_400 = fVar32;
    fStack_3fc = fVar10;
    local_128 = fVar34;
    fStack_124 = fVar34;
    fStack_120 = fVar34;
    fStack_11c = fVar34;
    fStack_114 = local_388._4_4_;
    fStack_110 = fVar30;
    fStack_10c = fVar31;
    do {
      local_378 = deRandom_getFloat((deRandom *)local_458);
      fVar29 = deRandom_getFloat((deRandom *)local_458);
      local_378 = local_378 * local_118 + 0.0 + (float)local_348;
      local_308 = fVar29 * (float)local_388 + 0.0 + local_128;
      local_418._4_4_ = local_308;
      local_418._0_4_ = local_378;
      pDStack_410 = (DeviceInterface *)0x3f80000000000000;
      local_408 = (float)local_2f8._32_8_;
      fStack_404 = SUB84(local_2f8._32_8_,4);
      fStack_400 = afStack_2d0[0];
      fStack_3fc = afStack_2d0[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_2b8,(value_type *)local_418);
      local_418._4_4_ = local_308 + 0.2;
      local_418._0_4_ = local_378 + 0.2;
      pDStack_410 = (DeviceInterface *)0x3f80000000000000;
      local_408 = (float)local_2f8._32_8_;
      fStack_404 = SUB84(local_2f8._32_8_,4);
      fStack_400 = afStack_2d0[0];
      fStack_3fc = afStack_2d0[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_2b8,(value_type *)local_418);
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
    break;
  case 2:
    local_118 = (float)local_388 + -0.2;
    local_388 = CONCAT44(local_388._4_4_,local_388._4_4_ + -0.2);
    uStack_380 = CONCAT44(local_388._4_4_,local_388._4_4_);
    iVar18 = 0x14;
    local_408 = fVar29;
    fStack_404 = fVar1;
    fStack_400 = fVar32;
    fStack_3fc = fVar10;
    local_128 = fVar34;
    fStack_124 = fVar34;
    fStack_120 = fVar34;
    fStack_11c = fVar34;
    fStack_114 = local_388._4_4_;
    fStack_110 = fVar30;
    fStack_10c = fVar31;
    do {
      local_378 = deRandom_getFloat((deRandom *)local_458);
      fVar29 = deRandom_getFloat((deRandom *)local_458);
      local_378 = local_378 * local_118 + 0.0 + (float)local_348;
      local_308 = fVar29 * (float)local_388 + 0.0 + local_128;
      local_418._4_4_ = local_308;
      local_418._0_4_ = local_378;
      pDStack_410 = (DeviceInterface *)0x3f80000000000000;
      local_408 = (float)local_2f8._32_8_;
      fStack_404 = SUB84(local_2f8._32_8_,4);
      fStack_400 = afStack_2d0[0];
      fStack_3fc = afStack_2d0[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_2b8,(value_type *)local_418);
      local_418._4_4_ = local_308 + 0.2;
      local_418._0_4_ = local_378 + 0.1;
      pDStack_410 = (DeviceInterface *)0x3f80000000000000;
      local_408 = (float)local_2f8._32_8_;
      fStack_404 = SUB84(local_2f8._32_8_,4);
      fStack_400 = afStack_2d0[0];
      fStack_3fc = afStack_2d0[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_2b8,(value_type *)local_418);
      local_418._4_4_ = local_308;
      local_418._0_4_ = local_378 + 0.2;
      pDStack_410 = (DeviceInterface *)0x3f80000000000000;
      local_408 = (float)local_2f8._32_8_;
      fStack_404 = SUB84(local_2f8._32_8_,4);
      fStack_400 = afStack_2d0[0];
      fStack_3fc = afStack_2d0[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_2b8,(value_type *)local_418);
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
    break;
  case 3:
    uStack_380 = CONCAT44(fVar31,fVar30);
    local_418._4_4_ = fVar34;
    local_418._0_4_ = fVar33;
    pDStack_410 = (DeviceInterface *)0x3f80000000000000;
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(&local_2b8,(value_type *)local_418);
    local_418._4_4_ = local_348._4_4_ + local_388._4_4_;
    local_418._0_4_ = (float)local_348 + (float)local_388;
    pDStack_410 = (DeviceInterface *)0x3f80000000000000;
    local_408 = (float)local_2f8._32_8_;
    fStack_404 = SUB84(local_2f8._32_8_,4);
    fStack_400 = afStack_2d0[0];
    fStack_3fc = afStack_2d0[1];
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(&local_2b8,(value_type *)local_418);
    local_2a0 = (long)local_2b8.
                      super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2b8.
                      super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    goto switchD_007f6263_caseD_7f6265;
  case 4:
    uStack_380 = CONCAT44(fVar31,fVar30);
    local_418._4_4_ = fVar34;
    local_418._0_4_ = fVar33;
    pDStack_410 = (DeviceInterface *)0x3f80000000000000;
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(&local_2b8,(value_type *)local_418);
    local_418._4_4_ = local_388._4_4_ + local_348._4_4_;
    local_418._0_4_ = (float)local_388 * 0.5 + (float)local_348;
    pDStack_410 = (DeviceInterface *)0x3f80000000000000;
    local_408 = (float)local_2f8._32_8_;
    fStack_404 = SUB84(local_2f8._32_8_,4);
    fStack_400 = afStack_2d0[0];
    fStack_3fc = afStack_2d0[1];
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(&local_2b8,(value_type *)local_418);
    local_418._4_4_ = local_348._4_4_;
    local_418._0_4_ = (float)local_388 + (float)local_348;
    pDStack_410 = (DeviceInterface *)0x3f80000000000000;
    local_408 = (float)local_2f8._32_8_;
    fStack_404 = SUB84(local_2f8._32_8_,4);
    fStack_400 = afStack_2d0[0];
    fStack_3fc = afStack_2d0[1];
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(&local_2b8,(value_type *)local_418);
    local_2a0 = (long)local_2b8.
                      super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2b8.
                      super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    goto switchD_007f6263_caseD_7f626c;
  }
LAB_007f6224:
  local_2a0 = (long)local_2b8.
                    super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2b8.
                    super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if (local_34c < (TEST_PRIMITIVE_BIG_TRIANGLE|TEST_PRIMITIVE_LINES)) {
    local_298 = local_34c;
    switch((long)&switchD_007f6263::switchdataD_00b55d14 +
           (long)(int)(&switchD_007f6263::switchdataD_00b55d14)[local_328]) {
    case 0x7f6265:
switchD_007f6263_caseD_7f6265:
      local_298 = TEST_PRIMITIVE_LINES;
      break;
    case 0x7f626c:
switchD_007f6263_caseD_7f626c:
      local_298 = TEST_PRIMITIVE_BIG_LINE;
    }
  }
  else {
    local_298 = 0xb;
  }
  local_290.order = R;
  local_290.type = SNORM_INT8;
  DStack_288.m_deviceIface = (DeviceInterface *)0x0;
  DStack_288.m_device = (VkDevice)0x0;
  DStack_288.m_allocator = (VkAllocationCallbacks *)0x0;
  local_270.order = R;
  local_270.type = SNORM_INT8;
  local_260.order = R;
  local_260.type = SNORM_INT8;
  DStack_258.m_deviceIface = (DeviceInterface *)0x0;
  DStack_258.m_device = (VkDevice)0x0;
  DStack_258.m_allocator = (VkAllocationCallbacks *)0x0;
  local_240.order = R;
  local_240.type = SNORM_INT8;
  DStack_238.m_deviceIface = (DeviceInterface *)0x0;
  DStack_238.m_device = (VkDevice)0x0;
  DStack_238.m_allocator = (VkAllocationCallbacks *)0x0;
  local_220.order = R;
  local_220.type = SNORM_INT8;
  memset(&local_210,0,0xe0);
  pCVar13 = local_358;
  pDVar20 = Context::getDeviceInterface(local_358);
  pVVar21 = Context::getDevice(pCVar13);
  local_378 = (float)Context::getUniversalQueueFamilyIndex(pCVar13);
  pAVar22 = Context::getDefaultAllocator(pCVar13);
  local_418._0_4_ = sRGB;
  pDStack_410 = (DeviceInterface *)0x0;
  local_408 = 0.0;
  fStack_404 = 1.4013e-45;
  fStack_400 = (float)local_2f8._8_4_;
  fStack_3fc = (float)local_2f8._0_8_;
  uStack_3f8._0_4_ = SUB84(local_2f8._0_8_,4);
  uStack_3f8._4_4_ = VK_SHARING_MODE_CONCURRENT;
  dStack_3f0 = 1;
  dStack_3ec = 1;
  VStack_3e8 = VK_SAMPLE_COUNT_1_BIT;
  local_3e4 = VK_IMAGE_TILING_OPTIMAL;
  VStack_3e0 = 0x11;
  VStack_3dc = VK_SHARING_MODE_EXCLUSIVE;
  dStack_3d8 = 0;
  local_3d0 = (deUint32 *)0x0;
  local_3c8 = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_3b8,pDVar20,pVVar21,
                    (VkImageCreateInfo *)local_418,(VkAllocationCallbacks *)0x0);
  uVar12 = local_3a8._8_8_;
  uVar11 = local_3a8._M_allocated_capacity;
  uVar5 = local_3b8._8_8_;
  uVar3 = local_3b8._0_8_;
  local_448 = (VkDevice)local_3a8._M_allocated_capacity;
  uStack_440 = local_3a8._8_8_;
  local_458._0_8_ = local_3b8._0_8_;
  local_458._8_8_ = local_3b8._8_8_;
  local_3b8._0_4_ = R;
  local_3b8._4_4_ = SNORM_INT8;
  uVar4 = local_3b8._0_8_;
  local_3b8._8_8_ = (DeviceInterface *)0x0;
  local_3a8._M_allocated_capacity = 0;
  local_3a8._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_290 == (TextureFormat)0x0) {
    DStack_288.m_device = (VkDevice)uVar11;
    DStack_288.m_allocator = (VkAllocationCallbacks *)uVar12;
    local_3b8._0_4_ = (undefined4)uVar3;
    local_3b8._4_4_ = SUB84(uVar3,4);
    local_290.order = local_3b8._0_4_;
    local_290.type = local_3b8._4_4_;
    DStack_288.m_deviceIface = (DeviceInterface *)uVar5;
    local_3b8._0_8_ = uVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_288,(VkImage)local_290);
    DStack_288.m_device = local_448;
    DStack_288.m_allocator = (VkAllocationCallbacks *)uStack_440;
    local_290.order = local_458._0_4_;
    local_290.type = local_458._4_4_;
    DStack_288.m_deviceIface = (DeviceInterface *)local_458._8_8_;
    if ((TextureFormat)local_3b8._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_3b8 + 8),(VkImage)local_3b8._0_8_
                );
    }
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_418,pDVar20,
            pVVar21,pAVar22,(VkImage)local_290,(MemoryRequirement)0x0);
  auVar8 = local_418;
  local_418._0_4_ = R;
  local_418._4_4_ = SNORM_INT8;
  auVar9 = local_418;
  local_418 = auVar9;
  if (local_270 != (TextureFormat)auVar8) {
    if (local_270 == (TextureFormat)0x0) {
      local_418._0_4_ = auVar8._0_4_;
      local_418._4_4_ = auVar8._4_4_;
      local_270.order = local_418._0_4_;
      local_270.type = local_418._4_4_;
    }
    else {
      (**(code **)(*(long *)local_270 + 8))();
      auVar9 = local_418;
      local_418._0_4_ = auVar8._0_4_;
      local_418._4_4_ = auVar8._4_4_;
      local_270.order = local_418._0_4_;
      local_270.type = local_418._4_4_;
      local_418 = auVar9;
      if ((TextureFormat)auVar9 != (TextureFormat)0x0) {
        (**(code **)(*(long *)auVar9 + 8))();
      }
    }
  }
  local_78 = CONCAT44(local_2f8._16_4_,local_2f8._12_4_);
  uStack_70 = CONCAT44(local_2f8._24_4_,local_2f8._20_4_);
  local_68 = local_2f8._28_4_;
  subresourceRange.baseMipLevel = local_2f8._16_4_;
  subresourceRange.aspectMask = local_2f8._12_4_;
  subresourceRange.levelCount = local_2f8._20_4_;
  subresourceRange.baseArrayLayer = local_2f8._24_4_;
  subresourceRange.layerCount = local_2f8._28_4_;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_458,pDVar20,pVVar21,
                (VkImage)local_290,VK_IMAGE_VIEW_TYPE_2D,local_2f8._8_4_,subresourceRange);
  VVar7.m_internal = uStack_440;
  pVVar6 = local_448;
  uVar5 = local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = SUB84(local_448,0);
  fStack_404 = (float)((ulong)local_448 >> 0x20);
  fStack_400 = (float)uStack_440;
  fStack_3fc = (float)(uStack_440 >> 0x20);
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  uVar4 = local_458._0_8_;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_260 == (TextureFormat)0x0) {
    DStack_258.m_device = pVVar6;
    DStack_258.m_allocator = (VkAllocationCallbacks *)VVar7.m_internal;
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_260.order = local_458._0_4_;
    local_260.type = local_458._4_4_;
    DStack_258.m_deviceIface = (DeviceInterface *)uVar5;
    local_458._0_8_ = uVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&DStack_258,(VkImageView)local_260);
    DStack_258.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_258.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_260.order = local_418._0_4_;
    local_260.type = local_418._4_4_;
    DStack_258.m_deviceIface = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_458 + 8),
                 (VkImageView)local_458._0_8_);
    }
  }
  makeBufferCreateInfo((VkBufferCreateInfo *)local_418,local_2a0,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3b8,pDVar20,pVVar21,
                     (VkBufferCreateInfo *)local_418,(VkAllocationCallbacks *)0x0);
  uVar12 = local_3a8._8_8_;
  uVar11 = local_3a8._M_allocated_capacity;
  uVar5 = local_3b8._8_8_;
  uVar3 = local_3b8._0_8_;
  local_448 = (VkDevice)local_3a8._M_allocated_capacity;
  uStack_440 = local_3a8._8_8_;
  local_458._0_8_ = local_3b8._0_8_;
  local_458._8_8_ = local_3b8._8_8_;
  local_3b8._0_8_ = (pointer)0x0;
  uVar4 = local_3b8._0_8_;
  local_3b8._8_8_ = (DeviceInterface *)0x0;
  local_3a8._M_allocated_capacity = 0;
  local_3a8._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_240 == (TextureFormat)0x0) {
    DStack_238.m_device = (VkDevice)uVar11;
    DStack_238.m_allocator = (VkAllocationCallbacks *)uVar12;
    local_3b8._0_4_ = (undefined4)uVar3;
    local_3b8._4_4_ = SUB84(uVar3,4);
    local_240.order = local_3b8._0_4_;
    local_240.type = local_3b8._4_4_;
    DStack_238.m_deviceIface = (DeviceInterface *)uVar5;
    local_3b8._0_8_ = uVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_238,(VkBuffer)local_240);
    DStack_238.m_device = local_448;
    DStack_238.m_allocator = (VkAllocationCallbacks *)uStack_440;
    local_240.order = local_458._0_4_;
    local_240.type = local_458._4_4_;
    DStack_238.m_deviceIface = (DeviceInterface *)local_458._8_8_;
    if ((pointer)local_3b8._0_8_ != (pointer)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_3b8 + 8),
                 (VkBuffer)local_3b8._0_8_);
    }
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_418,pDVar20,
             pVVar21,pAVar22,(VkBuffer)local_240,(MemoryRequirement)0x1);
  auVar8 = local_418;
  local_418._0_4_ = R;
  local_418._4_4_ = SNORM_INT8;
  auVar9 = local_418;
  local_418 = auVar9;
  if (local_220 != (TextureFormat)auVar8) {
    if (local_220 == (TextureFormat)0x0) {
      local_418._0_4_ = auVar8._0_4_;
      local_418._4_4_ = auVar8._4_4_;
      local_220.order = local_418._0_4_;
      local_220.type = local_418._4_4_;
    }
    else {
      (**(code **)(*(long *)local_220 + 8))();
      auVar9 = local_418;
      local_418._0_4_ = auVar8._0_4_;
      local_418._4_4_ = auVar8._4_4_;
      local_220.order = local_418._0_4_;
      local_220.type = local_418._4_4_;
      local_418 = auVar9;
      if ((TextureFormat)auVar9 != (TextureFormat)0x0) {
        (**(code **)(*(long *)auVar9 + 8))();
      }
    }
  }
  memcpy(*(void **)((long)local_220 + 0x18),
         local_2b8.
         super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
         ._M_impl.super__Vector_impl_data._M_start,local_2a0);
  ::vk::flushMappedMemoryRange
            (pDVar20,pVVar21,(VkDeviceMemory)*(deUint64 *)((long)local_220 + 8),
             *(VkDeviceSize *)((long)local_220 + 0x10),local_2a0);
  local_3b8._8_8_ = (DeviceInterface *)0x4;
  local_3a8._M_allocated_capacity._0_5_ = 0x74726576;
  local_3b8._0_8_ = &local_3a8;
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_358->m_progCollection,(key_type *)local_3b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_458,pDVar20,pVVar21,
             *(ProgramBinary **)(cVar24._M_node + 2),0);
  DStack_208.m_allocator = (VkAllocationCallbacks *)uStack_440;
  DStack_208.m_device = local_448;
  DStack_208.m_deviceIface = (DeviceInterface *)local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = SUB84(local_448,0);
  fStack_404 = (float)((ulong)local_448 >> 0x20);
  fStack_400 = (float)uStack_440;
  fStack_3fc = (float)(uStack_440 >> 0x20);
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_210 == (TextureFormat)0x0) {
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_210.order = local_458._0_4_;
    local_210.type = local_458._4_4_;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_208,(VkShaderModule)local_210);
    DStack_208.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_208.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_210.order = local_418._0_4_;
    local_210.type = local_418._4_4_;
    DStack_208.m_deviceIface = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_458 + 8),
                 (VkShaderModule)local_458._0_8_);
    }
  }
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  local_458._8_8_ = (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
  }
  local_3b8._8_8_ = (DeviceInterface *)0x4;
  local_3a8._M_allocated_capacity._0_5_ = 0x67617266;
  local_3b8._0_8_ = &local_3a8;
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_358->m_progCollection,(key_type *)local_3b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_458,pDVar20,pVVar21,
             *(ProgramBinary **)(cVar24._M_node + 2),0);
  DStack_1e8.m_allocator = (VkAllocationCallbacks *)uStack_440;
  DStack_1e8.m_device = local_448;
  DStack_1e8.m_deviceIface = (DeviceInterface *)local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = SUB84(local_448,0);
  fStack_404 = (float)((ulong)local_448 >> 0x20);
  fStack_400 = (float)uStack_440;
  fStack_3fc = (float)(uStack_440 >> 0x20);
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_1f0 == (TextureFormat)0x0) {
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_1f0.order = local_458._0_4_;
    local_1f0.type = local_458._4_4_;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_1e8,(VkShaderModule)local_1f0);
    DStack_1e8.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_1e8.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_1f0.order = local_418._0_4_;
    local_1f0.type = local_418._4_4_;
    DStack_1e8.m_deviceIface = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_458 + 8),
                 (VkShaderModule)local_458._0_8_);
    }
  }
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  local_458._8_8_ = (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
  }
  local_3b8._0_8_ = (ulong)(uint)local_2f8._8_4_ << 0x20;
  local_3b8._8_8_ = (DeviceInterface *)0x100000001;
  local_3a8._M_allocated_capacity = 0x200000000;
  local_3a8._8_8_ = &DAT_00000001;
  local_398 = 2;
  uStack_3f8 = &local_38;
  local_38 = 0x200000000;
  local_408 = 0.0;
  fStack_404 = 0.0;
  fStack_3fc = 0.0;
  dStack_3f0 = 0;
  dStack_3ec = 0;
  dStack_3d8 = 0;
  uStack_3d4 = 0;
  VStack_3e8 = 0;
  local_3e4 = VK_IMAGE_TILING_OPTIMAL;
  VStack_3e0 = 0;
  VStack_3dc = VK_SHARING_MODE_EXCLUSIVE;
  local_418._0_4_ = R;
  local_418._4_4_ = SNORM_INT8;
  pDStack_410 = (DeviceInterface *)0x0;
  fStack_400 = 1.4013e-45;
  local_458._0_4_ = 0x26;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x100000000;
  local_438 = 1;
  local_428 = 0;
  local_420 = (VkSubpassDependency *)0x0;
  uStack_440 = (deUint64)local_3b8;
  local_430 = (VkSubpassDescription *)local_418;
  ::vk::createRenderPass
            (&local_108,pDVar20,pVVar21,(VkRenderPassCreateInfo *)local_458,
             (VkAllocationCallbacks *)0x0);
  DStack_1c8.m_allocator =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  DStack_1c8.m_device =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_1c8.m_deviceIface =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  HVar14.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pVVar6 = local_310;
  local_408 = SUB84(local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device
                    ,0);
  fStack_404 = (float)((ulong)local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                              deleter.m_device >> 0x20);
  fStack_400 = SUB84(local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                     m_allocator,0);
  fStack_3fc = (float)((ulong)local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                              deleter.m_allocator >> 0x20);
  local_418 = (undefined1  [8])
              local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pDStack_410 = local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                m_deviceIface;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  HVar15.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1d0 == (TextureFormat)0x0) {
    local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ =
         (undefined4)HVar14.m_internal;
    local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_4_ =
         SUB84(HVar14.m_internal,4);
    local_1d0.order =
         (undefined4)
         local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
    local_1d0.type =
         local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_4_;
    local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         HVar15.m_internal;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_1c8,(VkRenderPass)local_1d0);
    DStack_1c8.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_1c8.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_1d0.order = local_418._0_4_;
    local_1d0.type = local_418._4_4_;
    DStack_1c8.m_deviceIface = pDStack_410;
    if (local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                 (VkRenderPass)
                 local_108.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
    }
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_458,pDVar20,pVVar21,
                  (VkRenderPass)local_1d0,1,(VkImageView *)&local_260,local_2f8._0_4_,
                  local_2f8._4_4_,1);
  DStack_1a8.m_allocator = (VkAllocationCallbacks *)uStack_440;
  DStack_1a8.m_device = local_448;
  DStack_1a8.m_deviceIface = (DeviceInterface *)local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = SUB84(local_448,0);
  fStack_404 = (float)((ulong)local_448 >> 0x20);
  fStack_400 = (float)uStack_440;
  fStack_3fc = (float)(uStack_440 >> 0x20);
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  uVar4 = local_458._0_8_;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_1b0 == (TextureFormat)0x0) {
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_1b0.order = local_458._0_4_;
    local_1b0.type = local_458._4_4_;
    local_458._0_8_ = uVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&DStack_1a8,(VkFramebuffer)local_1b0);
    DStack_1a8.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_1a8.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_1b0.order = local_418._0_4_;
    local_1b0.type = local_418._4_4_;
    DStack_1a8.m_deviceIface = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_458 + 8),
                 (VkFramebuffer)local_458._0_8_);
    }
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_458,pDVar20,pVVar21);
  DStack_188.m_allocator = (VkAllocationCallbacks *)uStack_440;
  DStack_188.m_device = local_448;
  DStack_188.m_deviceIface = (DeviceInterface *)local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = SUB84(local_448,0);
  fStack_404 = (float)((ulong)local_448 >> 0x20);
  fStack_400 = (float)uStack_440;
  fStack_3fc = (float)(uStack_440 >> 0x20);
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  uVar4 = local_458._0_8_;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_190 == (TextureFormat)0x0) {
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_190.order = local_458._0_4_;
    local_190.type = local_458._4_4_;
    local_458._0_8_ = uVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_188,(VkPipelineLayout)local_190);
    DStack_188.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_188.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_190.order = local_418._0_4_;
    local_190.type = local_418._4_4_;
    DStack_188.m_deviceIface = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_458 + 8),
                 (VkPipelineLayout)local_458._0_8_);
    }
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_458,pDVar20,pVVar21,2,
             (deUint32)local_378,(VkAllocationCallbacks *)0x0);
  DStack_168.m_allocator = (VkAllocationCallbacks *)uStack_440;
  DStack_168.m_device = local_448;
  DStack_168.m_deviceIface = (DeviceInterface *)local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = SUB84(local_448,0);
  fStack_404 = (float)((ulong)local_448 >> 0x20);
  fStack_400 = (float)uStack_440;
  fStack_3fc = (float)(uStack_440 >> 0x20);
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  uVar4 = local_458._0_8_;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_170 == (TextureFormat)0x0) {
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_170.order = local_458._0_4_;
    local_170.type = local_458._4_4_;
    local_458._0_8_ = uVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_168,(VkCommandPool)local_170);
    DStack_168.m_device = (VkDevice)CONCAT44(fStack_404,local_408);
    DStack_168.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_3fc,fStack_400);
    local_170.order = local_418._0_4_;
    local_170.type = local_418._4_4_;
    DStack_168.m_deviceIface = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_458 + 8),
                 (VkCommandPool)local_458._0_8_);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_458,pDVar20,pVVar21,(VkCommandPool)local_170,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar7.m_internal = uStack_440;
  pVVar21 = local_448;
  uVar5 = local_458._8_8_;
  uVar3 = local_458._0_8_;
  local_408 = (float)local_448;
  fStack_404 = local_448._4_4_;
  fStack_400 = (float)uStack_440;
  fStack_3fc = uStack_440._4_4_;
  local_418 = (undefined1  [8])local_458._0_8_;
  pDStack_410 = (DeviceInterface *)local_458._8_8_;
  local_458._0_4_ = R;
  local_458._4_4_ = SNORM_INT8;
  uVar4 = local_458._0_8_;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  uStack_440 = 0;
  if (local_150 == (TextureFormat)0x0) {
    local_140 = pVVar21;
    uStack_138 = VVar7.m_internal;
    local_458._0_4_ = (undefined4)uVar3;
    local_458._4_4_ = SUB84(uVar3,4);
    local_150.order = local_458._0_4_;
    local_150.type = local_458._4_4_;
    pDStack_148 = (DeviceInterface *)uVar5;
    local_458._0_8_ = uVar4;
  }
  else {
    local_3b8._0_4_ = local_150.order;
    local_3b8._4_4_ = local_150.type;
    (*pDStack_148->_vptr_DeviceInterface[0x48])(pDStack_148,local_140,uStack_138,1);
    local_140 = (VkDevice)CONCAT44(fStack_404,local_408);
    uStack_138._4_4_ = fStack_3fc;
    uStack_138._0_4_ = fStack_400;
    local_150.order = local_418._0_4_;
    local_150.type = local_418._4_4_;
    pDStack_148 = pDStack_410;
    if ((TextureFormat)local_458._0_8_ != (TextureFormat)0x0) {
      local_418 = (undefined1  [8])local_458._0_8_;
      (*(*(_func_int ***)local_458._8_8_)[0x48])(local_458._8_8_,local_448,uStack_440,1);
    }
  }
  pCVar13 = local_358;
  ScissorRenderer::draw((ScissorRenderer *)local_2f8,local_358,&local_48,(VkBuffer)local_98);
  ScissorRenderer::draw
            ((ScissorRenderer *)local_2f8,pCVar13,&local_330->scissorArea,(VkBuffer)local_b8);
  ScissorRenderer::~ScissorRenderer((ScissorRenderer *)local_2f8);
  pDVar20 = local_318;
  VVar26 = local_320;
  ::vk::invalidateMappedMemoryRange
            (local_318,pVVar6,(VkDeviceMemory)((VkDeviceMemory *)((long)local_360 + 8))->m_internal,
             0,local_320);
  ::vk::invalidateMappedMemoryRange
            (pDVar20,pVVar6,(VkDeviceMemory)((VkDeviceMemory *)((long)local_368 + 8))->m_internal,0,
             VVar26);
  local_418 = (undefined1  [8])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_2f8,(TextureFormat *)local_418,0x80,0x80,1,
             *(void **)((long)local_368 + 0x18));
  local_458._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_418,(TextureFormat *)local_458,0x80,0x80,1,
             *(void **)((long)local_360 + 0x18));
  local_e0._0_8_ = local_418;
  stack0xffffffffffffff28 = pDStack_410;
  pDVar20 = stack0xffffffffffffff28;
  local_d0 = local_408;
  local_c4 = fStack_3fc;
  local_cc[1] = (int)fStack_400;
  local_cc[0] = (int)fStack_404;
  local_c0 = uStack_3f8;
  iStack_d4 = (int)((ulong)pDStack_410 >> 0x20);
  if (0 < iStack_d4) {
    iVar19 = (int)pDStack_410;
    fVar32 = (float)iStack_d4;
    iVar27 = (int)((local_330->scissorArea).m_data[0] * (float)iVar19);
    iVar28 = (int)((local_330->scissorArea).m_data[1] * fVar32);
    fVar29 = (local_330->scissorArea).m_data[2];
    fVar1 = (local_330->scissorArea).m_data[3];
    y = 0;
    pDVar25 = pDStack_410;
    iVar18 = iStack_d4;
    unique0x10004507 = pDVar20;
    do {
      if (0 < (int)pDVar25) {
        iVar18 = 0;
        do {
          if ((((iVar18 < iVar27) || ((int)((float)iVar19 * fVar29) + iVar27 <= iVar18)) ||
              (y < iVar28)) || ((int)(fVar32 * fVar1) + iVar28 <= y)) {
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_e0,(Vec4 *)&local_58,iVar18,y,0);
            pDVar25 = (DeviceInterface *)((ulong)stack0xffffffffffffff28 & 0xffffffff);
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 < (int)pDVar25);
        iVar18 = iStack_d4;
      }
      y = y + 1;
      pDVar20 = stack0xffffffffffffff28;
    } while (y < iVar18);
  }
  stack0xffffffffffffff28 = pDVar20;
  local_458._0_4_ = 0x3ca3d70a;
  local_458._4_4_ = 0x3ca3d70a;
  local_458._8_8_ = (DeviceInterface *)0x3ca3d70a3ca3d70a;
  bVar17 = tcu::floatThresholdCompare
                     (local_358->m_testCtx->m_log,"color","Image compare",
                      (ConstPixelBufferAccess *)local_418,(ConstPixelBufferAccess *)local_2f8,
                      (Vec4 *)local_458,COMPARE_LOG_RESULT);
  pTVar16 = local_e8;
  if (bVar17) {
    local_2f8._0_8_ = (long)local_2f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"OK","");
    pTVar16->m_code = QP_TEST_RESULT_PASS;
    (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar16->m_description,local_2f8._0_8_,
               CONCAT44(local_2f8._12_4_,local_2f8._8_4_) + local_2f8._0_8_);
    if (local_2f8._0_8_ == (long)local_2f8 + 0x10) goto LAB_007f7029;
    pVVar21 = (VkDevice)CONCAT44(local_2f8._20_4_,local_2f8._16_4_);
    TVar23 = (TextureFormat)local_2f8._0_8_;
  }
  else {
    local_458._0_8_ = &local_448;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458,"Rendered image is not correct","");
    pTVar16->m_code = QP_TEST_RESULT_FAIL;
    (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar16->m_description,local_458._0_8_,
               (long)(_func_int ***)local_458._8_8_ + local_458._0_8_);
    pVVar21 = local_448;
    TVar23 = (TextureFormat)local_458._0_8_;
    if ((undefined8 *)local_458._0_8_ == &local_448) goto LAB_007f7029;
  }
  operator_delete((void *)TVar23,(ulong)(pVVar21 + 1));
LAB_007f7029:
  if (local_368 != (TextureFormat)0x0) {
    (**(code **)(*(long *)local_368 + 8))();
  }
  if (local_b8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_b0,(VkBuffer)local_b8);
  }
  if (local_360 != (TextureFormat)0x0) {
    (**(code **)(*(long *)local_360 + 8))();
  }
  if (local_98 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_90,(VkBuffer)local_98);
  }
  return pTVar16;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk							= context.getDeviceInterface();
	const VkDevice					device						= context.getDevice();
	Allocator&						allocator					= context.getDefaultAllocator();

	const IVec2						renderSize					(128, 128);
	const VkFormat					colorFormat					= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						scissorFullArea				(0.0f, 0.0f, 1.0f, 1.0f);
	const Vec4						primitiveColor				(1.0f, 1.0f, 1.0f, 1.0f);
	const Vec4						clearColor					(0.5f, 0.5f, 1.0f, 1.0f);

	const VkDeviceSize				colorBufferSize				= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBufferFull				(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferFullAlloc		(bindBuffer(vk, device, allocator, *colorBufferFull, MemoryRequirement::HostVisible));

	const Unique<VkBuffer>			colorBufferScissored		(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferScissoredAlloc	(bindBuffer(vk, device, allocator, *colorBufferScissored, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferFullAlloc, colorBufferSize);
	zeroBuffer(vk, device, *colorBufferScissoredAlloc, colorBufferSize);

	// Draw
	{
		const ScissorRenderer renderer (context, caseDef, renderSize, colorFormat, primitiveColor, clearColor);

		renderer.draw(context, scissorFullArea, *colorBufferFull);
		renderer.draw(context, caseDef.scissorArea, *colorBufferScissored);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferFullAlloc->getMemory(), 0ull, colorBufferSize);
		invalidateMappedMemoryRange(vk, device, colorBufferScissoredAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferScissoredAlloc->getHostPtr());
		tcu::PixelBufferAccess				referenceImage	(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferFullAlloc->getHostPtr());

		// Apply scissor to the full image, so we can compare it with the result image.
		applyScissor (referenceImage, caseDef.scissorArea, clearColor);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage, resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}